

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Hash.cpp
# Opt level: O1

uint __thiscall
HashTbl::CountAndVerifyItems(HashTbl *this,IdentPtr *buckets,uint bucketCount,uint mask)

{
  code *pcVar1;
  bool bVar2;
  undefined4 *puVar3;
  IdentPtr pIVar4;
  uint uVar5;
  ulong uVar6;
  
  if (bucketCount == 0) {
    uVar5 = 0;
  }
  else {
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    uVar6 = 0;
    uVar5 = 0;
    do {
      for (pIVar4 = buckets[uVar6]; pIVar4 != (IdentPtr)0x0; pIVar4 = pIVar4->m_pidNext) {
        if (uVar6 != (pIVar4->m_luHash & mask)) {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          *puVar3 = 1;
          bVar2 = Js::Throw::ReportAssert
                            ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/Hash.cpp"
                             ,0x7d,"((pid->m_luHash & mask) == i)","(pid->m_luHash & mask) == i");
          if (!bVar2) {
            pcVar1 = (code *)invalidInstructionException();
            (*pcVar1)();
          }
          *puVar3 = 0;
        }
        uVar5 = uVar5 + 1;
      }
      uVar6 = uVar6 + 1;
    } while (uVar6 != bucketCount);
  }
  return uVar5;
}

Assistant:

uint HashTbl::CountAndVerifyItems(IdentPtr *buckets, uint bucketCount, uint mask)
{
    uint count = 0;
    for (uint i = 0; i < bucketCount; i++)
        for (IdentPtr pid = buckets[i]; pid; pid = pid->m_pidNext)
        {
            Assert((pid->m_luHash & mask) == i);
            count++;
        }
    return count;
}